

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-danger.c
# Opt level: O2

wchar_t borg_danger_one_kill
                  (wchar_t y,wchar_t x,wchar_t c,wchar_t i,_Bool average,_Bool full_damage)

{
  bitflag *flags;
  wchar_t *pwVar1;
  ushort uVar2;
  wchar_t y_00;
  monster_blow *pmVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  chunk_conflict *pcVar10;
  monster_race *pmVar11;
  monster_race *pmVar12;
  _Bool _Var13;
  _Bool _Var14;
  short sVar15;
  short sVar16;
  short sVar17;
  wchar_t wVar18;
  int iVar19;
  wchar_t wVar20;
  wchar_t wVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  wchar_t wVar28;
  loc lVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  ushort uVar35;
  int iVar36;
  int iVar37;
  ulong uVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  byte bVar48;
  int iVar49;
  borg_kill *pbVar50;
  long lVar51;
  int iVar52;
  int iVar53;
  wchar_t wVar54;
  long lVar55;
  uint uVar56;
  ulong uVar57;
  borg_kill *pbVar58;
  long lVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  wchar_t local_124;
  int local_108;
  uint local_f4;
  int iVar42;
  
  pmVar11 = r_info;
  uVar38 = (ulong)borg_kills[i].r_idx;
  if (uVar38 == 0) {
    return L'\0';
  }
  if ((int)(z_info->r_max - 1) <= (int)(uint)borg_kills[i].r_idx) {
    return L'd';
  }
  wVar28 = borg_kills[i].pos.x;
  y_00 = borg_kills[i].pos.y;
  if (borg_tp_other_n != 0) {
    sVar15 = -1;
    if (-1 < borg_tp_other_n) {
      sVar15 = borg_tp_other_n;
    }
    lVar59 = 0;
    while ((long)sVar15 + 1 != lVar59) {
      pwVar1 = borg_tp_other_index + lVar59;
      lVar59 = lVar59 + 1;
      if (*pwVar1 == i) {
        return L'\0';
      }
    }
  }
  uVar30 = wVar28 - x;
  uVar56 = -uVar30;
  if (0 < (int)uVar30) {
    uVar56 = uVar30;
  }
  uVar31 = y_00 - y;
  uVar30 = -uVar31;
  if (0 < (int)uVar31) {
    uVar30 = uVar31;
  }
  if (uVar30 < uVar56) {
    uVar30 = uVar56;
  }
  iVar49 = uVar30 + (uVar30 == 0);
  if (0x14 < uVar30) {
    return L'\0';
  }
  iVar36 = (uint)(borg_fighting_unique == L'\0') * 5 + 0x78;
  if (borg.trait[0x2c] < 0x87) {
    iVar36 = borg.trait[0x2c];
  }
  iVar47 = iVar36 + 10;
  if (!borg.temp.fast) {
    iVar47 = iVar36;
  }
  uVar56 = borg_kills[i].speed - 10;
  if (!borg_slow_spell) {
    uVar56 = (uint)borg_kills[i].speed;
  }
  uVar31 = uVar56;
  if ((borg.trait[0x1c] < 0x14) && (uVar31 = uVar56 + 3, borg.trait[0x69] == 0)) {
    uVar31 = uVar56;
  }
  uVar56 = (((uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                   [(int)uVar31] *
            (("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
              [iVar47] + 99) /
            (uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                  [iVar47])) / 10) * c;
  if (full_damage) {
    uVar56 = (uVar56 + 9) - (int)(uVar56 + 9) % 10;
  }
  pbVar50 = borg_kills + i;
  local_f4 = uVar56;
  if ((int)uVar56 < 0xb) {
    local_f4 = 10;
  }
  sVar15 = (short)borg.trait[0x85] + 0x32;
  if (!borg.temp.shield) {
    sVar15 = (short)borg.trait[0x85];
  }
  bVar60 = true;
  if ((borg.temp.prot_from_evil) &&
     (_Var13 = flag_has_dbg(r_info[uVar38].flags,0xb,0x3d,"r_ptr->flags","RF_EVIL"), _Var13)) {
    bVar60 = borg.trait[0x23] < pmVar11[uVar38].level;
  }
  wVar20 = L'Ϩ';
  if ((pbVar50->r_idx != 0) && ((int)(uint)pbVar50->r_idx < (int)(z_info->r_max - 1))) {
    sVar16 = 0x96;
    if (sVar15 < 0x96) {
      sVar16 = sVar15;
    }
    uVar57 = 0;
    wVar20 = L'\0';
    for (lVar59 = 0x20;
        (uVar57 < z_info->mon_blows_max &&
        (pmVar3 = pmVar11[uVar38].blow, *(long *)((long)pmVar3 + lVar59 + -0x18) != 0));
        lVar59 = lVar59 + 0x30) {
      iVar36 = *(int *)((long)pmVar3 + lVar59 + -4);
      iVar47 = *(int *)((long)&pmVar3->next + lVar59);
      wVar18 = borg_mon_blow_effect((char *)**(undefined8 **)((long)pmVar3 + lVar59 + -0x10));
      iVar19 = 0;
      iVar32 = 0x3c;
      iVar45 = 0;
      switch(wVar18) {
      case L'\x01':
        iVar45 = iVar47 * iVar36;
        wVar18 = wVar20 + L'Ɛ';
        if (iVar36 < 6) {
          wVar18 = wVar20;
        }
        if (2 < iVar47) {
          wVar18 = wVar20;
        }
        wVar20 = wVar18;
        if ((!bVar60) && (borg_attacking == false)) {
          iVar45 = iVar45 / 2;
        }
        break;
      case L'\x02':
        iVar45 = iVar47 * iVar36;
        if ((borg.trait[0x49] == 0) && (borg.temp.res_pois == false)) {
          iVar45 = iVar45 + 10;
          goto LAB_001f34bc;
        }
        goto LAB_001f34d3;
      case L'\x03':
        iVar45 = iVar47 * iVar36;
        if (((borg.trait[0x54] != 0) || (iVar45 = iVar45 + 500, bVar60)) ||
           (borg_attacking != false)) {
          iVar32 = 0x14;
        }
        else {
          iVar45 = iVar45 / 2;
          iVar32 = 0x14;
        }
        break;
      case L'\x04':
        iVar45 = iVar47 * iVar36 + 0x14;
        iVar32 = 0xf;
        goto joined_r0x001f35ce;
      case L'\x05':
        iVar45 = iVar47 * iVar36 + 0x32;
        if (4 < borg.trait[0x23]) {
          iVar45 = iVar47 * iVar36;
        }
        if (((borg.trait[0x23] + adj_dex_safe[borg.trait[0x12]] < 100) &&
            (0xfffe79c2 < borg.trait[0x2d] - 0x186a1U)) &&
           ((iVar45 = iVar45 + 5, !bVar60 && (borg_attacking == false)))) goto LAB_001f37a1;
        goto LAB_001f37a4;
      case L'\x06':
        iVar45 = iVar47 * iVar36;
        if (99 < borg.trait[0x23] + adj_dex_safe[borg.trait[0x12]]) goto LAB_001f34d3;
        goto LAB_001f34b9;
      case L'\a':
        iVar32 = borg.trait[0x27];
        goto joined_r0x001f32ee;
      case L'\b':
        iVar45 = iVar47 * iVar36;
        if (borg_items[(ulong)z_info->pack_size + 5].timeout == 0) {
          iVar32 = 5;
          goto LAB_001f3732;
        }
        _Var13 = flag_has_dbg(borg_items[(ulong)z_info->pack_size + 5].flags,5,0x15,
                              "borg_items[INVEN_LIGHT].flags","OF_NO_FUEL");
        if (_Var13) goto LAB_001f34d3;
        iVar32 = borg.trait[0xd5];
joined_r0x001f32ee:
        iVar45 = iVar47 * iVar36;
        if (iVar32 < 6) {
LAB_001f34b9:
          iVar45 = iVar47 * iVar36 + 5;
LAB_001f34bc:
          if ((!bVar60) && (borg_attacking == false)) {
LAB_001f37a1:
            iVar45 = iVar45 / 2;
LAB_001f37a4:
            iVar32 = 5;
            break;
          }
        }
LAB_001f34d3:
        iVar32 = 5;
        break;
      case L'\t':
        iVar45 = iVar19;
        if (borg.trait[0x41] != 0) goto switchD_001f2e88_default;
        iVar47 = iVar47 * iVar36;
        if (borg.trait[0x48] != 0) {
          iVar47 = (iVar47 + 2) / 3;
        }
        if (borg.temp.res_acid == true) {
          iVar47 = (iVar47 + 2) / 3;
        }
        iVar45 = iVar47 + 200;
LAB_001f377f:
        if (!bVar60) goto joined_r0x001f37d1;
LAB_001f3798:
        iVar32 = 0;
        break;
      case L'\n':
        iVar45 = iVar19;
        if (borg.trait[0x43] == 0) {
          iVar47 = iVar47 * iVar36;
          if (borg.trait[0x47] != 0) {
            iVar47 = (iVar47 + 2) / 3;
          }
          if (borg.temp.res_elec != true) goto LAB_001f2fe5;
LAB_001f2fd8:
          iVar47 = (iVar47 + 2) / 3;
LAB_001f2fe5:
          iVar45 = iVar47 * 2;
          if (bVar60) goto LAB_001f2ff3;
          if (borg_attacking != false) {
            iVar47 = iVar45;
          }
          goto LAB_001f3728;
        }
      default:
switchD_001f2e88_default:
        iVar32 = 0;
        break;
      case L'\v':
        iVar45 = iVar19;
        if (borg.trait[0x40] == 0) {
          iVar47 = iVar47 * iVar36;
          cVar7 = borg.temp.res_fire;
          if (borg.trait[0x45] != 0) {
            iVar47 = (iVar47 + 2) / 3;
          }
joined_r0x001f2fd6:
          if (cVar7 == '\x01') goto LAB_001f2fd8;
          goto LAB_001f2fe5;
        }
        goto switchD_001f2e88_default;
      case L'\f':
        if (borg.trait[0x42] == 0) {
          iVar47 = iVar47 * iVar36;
          cVar7 = borg.temp.res_acid;
          if (borg.trait[0x46] != 0) {
            iVar47 = (iVar47 + 2) / 3;
          }
          goto joined_r0x001f2fd6;
        }
        goto switchD_001f2e88_default;
      case L'\r':
        iVar45 = iVar47 * iVar36;
        if (borg.trait[0x4d] == 0) {
          iVar36 = iVar45 + 10;
          iVar45 = iVar45 + 0x55;
          if (borg.trait[0x19] != 1) {
            iVar45 = iVar36;
          }
          if ((!bVar60) && (borg_attacking == false)) goto LAB_001f37bf;
          iVar32 = 2;
        }
        else {
LAB_001f3241:
          iVar32 = 2;
        }
        break;
      case L'\x0e':
        iVar47 = iVar47 * iVar36;
        if (borg.trait[0x4e] != 0) goto LAB_001f3728;
        iVar45 = iVar47 + 400;
        if (borg.trait[0x19] != 1) {
          iVar45 = iVar47 + 200;
        }
        if (!bVar60) {
          if (borg_attacking == false) {
            iVar45 = iVar45 / 2;
          }
          iVar32 = 10;
          break;
        }
LAB_001f2ff3:
        iVar32 = 10;
        break;
      case L'\x0f':
        iVar47 = iVar47 * iVar36;
        if (borg.trait[0x4a] == 0) goto LAB_001f2fe5;
LAB_001f3728:
        iVar45 = iVar47;
        iVar32 = 10;
        break;
      case L'\x10':
        iVar45 = iVar47 * iVar36;
        if (((borg.trait[0x56] != 0) || (iVar45 = iVar45 + 200, bVar60)) ||
           (borg_attacking != false)) goto LAB_001f3241;
LAB_001f37bf:
        iVar32 = 2;
        iVar45 = iVar45 / 2;
        break;
      case L'\x11':
        iVar45 = iVar47 * iVar36;
        if ((borg.trait[0x14] == 0) && (3 < borg.trait[10])) {
          _Var13 = borg_spell_legal(RESTORATION);
          if ((_Var13) ||
             ((_Var13 = borg_spell_legal(REVITALIZE), _Var13 ||
              (_Var13 = borg_spell_legal(UNHOLY_REPRIEVE), _Var13)))) goto LAB_001f370d;
          iVar36 = iVar45 + 0x96;
          iVar45 = iVar45 + 0xfa;
          bVar63 = SBORROW4(borg.trait[10],10);
          bVar62 = borg.trait[10] + -10 < 0;
LAB_001f3653:
          if (bVar63 == bVar62) {
            iVar45 = iVar36;
          }
          goto LAB_001f377f;
        }
        goto LAB_001f37f1;
      case L'\x12':
        iVar45 = iVar47 * iVar36;
        if ((borg.trait[0x15] != 0) || (borg.trait[0xb] < 4)) goto LAB_001f37f1;
        _Var13 = borg_spell_legal(RESTORATION);
        if ((_Var13) ||
           ((_Var13 = borg_spell_legal(REVITALIZE), _Var13 ||
            (_Var13 = borg_spell_legal(UNHOLY_REPRIEVE), _Var13)))) goto LAB_001f370d;
        wVar18 = borg_spell_stat();
        bVar62 = wVar18 == L'\x01';
LAB_001f3534:
        iVar45 = iVar47 * iVar36 + 200;
        if (!bVar62) {
          iVar45 = iVar47 * iVar36 + 0x96;
        }
        if (!bVar60) goto joined_r0x001f37d1;
LAB_001f3711:
        iVar32 = 0;
        break;
      case L'\x13':
        iVar45 = iVar47 * iVar36;
        if ((borg.trait[0x16] == 0) && (3 < borg.trait[0xc])) {
          _Var13 = borg_spell_legal(RESTORATION);
          if ((!_Var13) && (_Var13 = borg_spell_legal(REVITALIZE), !_Var13)) {
            wVar18 = borg_spell_stat();
            bVar62 = wVar18 == L'\x02';
            goto LAB_001f3534;
          }
LAB_001f370d:
          iVar45 = iVar47 * iVar36;
          goto LAB_001f3711;
        }
        goto LAB_001f37f1;
      case L'\x14':
        iVar45 = iVar47 * iVar36;
        if ((borg.trait[0x17] == 0) && (3 < borg.trait[0xd])) {
          _Var13 = borg_spell_legal(RESTORATION);
          if ((!_Var13) && (_Var13 = borg_spell_legal(REVITALIZE), !_Var13)) {
            iVar36 = iVar45 + 0x96;
            iVar45 = iVar45 + 0xfa;
            bVar63 = SBORROW4(borg.trait[0xd],10);
            bVar62 = borg.trait[0xd] + -10 < 0;
            goto LAB_001f3653;
          }
          goto LAB_001f370d;
        }
        goto LAB_001f37f1;
      case L'\x15':
        iVar45 = iVar47 * iVar36;
        if ((borg.trait[0x18] == 0) && (3 < borg.trait[0xe])) {
          _Var13 = borg_spell_legal(RESTORATION);
          if ((!_Var13) &&
             ((_Var13 = borg_spell_legal(REVITALIZE), !_Var13 &&
              (_Var13 = borg_spell_legal(UNHOLY_REPRIEVE), !_Var13)))) {
            iVar36 = iVar45 + 0x96;
            iVar45 = iVar45 + 0xfa;
            bVar63 = SBORROW4(borg.trait[10],8);
            bVar62 = borg.trait[10] + -8 < 0;
            goto LAB_001f3653;
          }
          goto LAB_001f370d;
        }
        goto LAB_001f37f1;
      case L'\x16':
        iVar32 = 2;
LAB_001f3732:
        iVar45 = iVar47 * iVar36;
        break;
      case L'\x17':
        iVar45 = (iVar47 * iVar36 * (int)sVar16) / -0xfa + iVar47 * iVar36 + 0x96;
joined_r0x001f35ce:
        if ((!bVar60) && (borg_attacking == false)) {
          iVar45 = iVar45 / 2;
        }
        break;
      case L'\x18':
        iVar45 = iVar47 * iVar36;
        if ((borg.trait[0x55] == 0) && (borg.trait[0x23] != 0x32)) {
          _Var13 = borg_spell_legal(REMEMBRANCE);
          if ((_Var13) ||
             ((_Var13 = borg_spell_legal(UNHOLY_REPRIEVE), _Var13 ||
              (_Var13 = borg_spell_legal(REVITALIZE), _Var13)))) goto LAB_001f370d;
          iVar45 = iVar45 + 100;
LAB_001f37db:
          if ((bVar60) || (borg_attacking != false)) goto LAB_001f37f1;
LAB_001f3796:
          iVar45 = iVar45 / 2;
          goto LAB_001f3798;
        }
        goto LAB_001f37f1;
      case L'\x19':
        iVar45 = iVar47 * iVar36;
        if ((borg.trait[0x55] == 0) && (borg.trait[0x23] < 0x32)) {
          _Var13 = borg_spell_legal(REMEMBRANCE);
          if ((!_Var13) &&
             ((_Var13 = borg_spell_legal(UNHOLY_REPRIEVE), !_Var13 &&
              (_Var13 = borg_spell_legal(REVITALIZE), !_Var13)))) {
            iVar45 = iVar45 + 0x96;
            goto LAB_001f37db;
          }
          goto LAB_001f370d;
        }
        goto LAB_001f37f1;
      case L'\x1a':
        iVar45 = iVar47 * iVar36;
        if ((borg.trait[0x55] == 0) && (borg.trait[0x23] < 0x32)) {
          _Var13 = borg_spell_legal(REMEMBRANCE);
          if ((!_Var13) &&
             ((_Var13 = borg_spell_legal(UNHOLY_REPRIEVE), !_Var13 &&
              (_Var13 = borg_spell_legal(REVITALIZE), !_Var13)))) {
            iVar45 = iVar45 + 200;
            goto LAB_001f37db;
          }
          goto LAB_001f370d;
        }
        goto LAB_001f37f1;
      case L'\x1b':
        iVar45 = iVar47 * iVar36;
        if ((borg.trait[0x55] == 0) && (borg.trait[0x23] < 0x32)) {
          _Var13 = borg_spell_legal(REMEMBRANCE);
          if ((!_Var13) &&
             ((_Var13 = borg_spell_legal(UNHOLY_REPRIEVE), !_Var13 &&
              (_Var13 = borg_spell_legal(REVITALIZE), !_Var13)))) {
            iVar45 = iVar45 + 0xfa;
            goto LAB_001f37db;
          }
          goto LAB_001f370d;
        }
LAB_001f37f1:
        iVar32 = 0;
        break;
      case L'\x1c':
        iVar45 = iVar47 * iVar36 + 0xfa;
        if (!bVar60) {
joined_r0x001f37d1:
          if (borg_attacking == false) goto LAB_001f3796;
          goto LAB_001f3798;
        }
        goto switchD_001f2e88_default;
      }
      uVar31 = iVar45 - borg.trait[0x2f];
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      if (!full_damage) {
        iVar32 = iVar32 + pmVar11[uVar38].level;
        iVar36 = iVar32 * -3 + sVar15 * -0x4b + 0x96;
        if (iVar36 < 6) {
          iVar36 = 5;
        }
        iVar47 = 5;
        if (0 < iVar32) {
          iVar47 = iVar36;
        }
        if (borg_fighting_unique != L'\0') {
          iVar47 = iVar36;
        }
        uVar31 = (iVar47 * uVar31) / 100;
      }
      wVar20 = uVar31 + wVar20;
      uVar57 = uVar57 + 1;
    }
  }
  wVar18 = wVar20;
  if (25000 < borg_t) {
    wVar18 = wVar20 / 5;
  }
  if (0x4b0 < borg.time_this_panel) {
    wVar18 = wVar20 / 5;
  }
  flags = pmVar11[uVar38].flags;
  _Var13 = flag_has_dbg(flags,0xb,0x14,"r_ptr->flags","RF_NEVER_BLOW");
  _Var14 = flag_has_dbg(flags,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE");
  if (_Var13) {
    wVar18 = L'\0';
  }
  wVar20 = L'\0';
  if (!_Var14) {
    wVar20 = wVar18;
  }
  if (uVar30 < 2) {
    wVar20 = wVar18;
  }
  _Var13 = flag_has_dbg(flags,0xb,0x11,"r_ptr->flags","RF_MULTIPLY");
  if ((_Var13) && (borg.trait[0x23] < 0x14)) {
    wVar20 = wVar20 + (wVar20 * 0xf) / 10;
  }
  if (((pmVar11[uVar38].friends != (monster_friends *)0x0) ||
      (pmVar11[uVar38].friends_base != (monster_friends_base *)0x0)) && (borg.trait[0x23] < 0x14)) {
    if (borg.trait[0x23] < 0xf) {
      iVar36 = wVar20 * 0x12;
    }
    else {
      iVar36 = wVar20 * 0xd;
    }
    wVar20 = wVar20 + iVar36 / 10;
  }
  if (pbVar50->awake == true) {
    bVar60 = uVar30 < 2;
    if ((bVar60) && (borg_sleep_spell_ii != false)) {
      _Var13 = flag_has_dbg(flags,0xb,0x52,"r_ptr->flags","RF_NO_SLEEP");
      bVar60 = true;
      if ((!_Var13) &&
         ((_Var13 = flag_has_dbg(flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var13 &&
          ((int)pbVar50->level <= borg.trait[0x23] + -0xf)))) {
        if ((borg.trait[0x23] < 0x14) && (borg.trait[0x1b] < borg.trait[0x1c] / 2)) {
          wVar20 = L'\0';
        }
        else {
          wVar20 = wVar20 / 3;
        }
      }
    }
  }
  else {
    wVar18 = wVar20 / 2;
    if (borg.trait[0x23] < 0x19) {
      wVar18 = wVar20;
    }
    wVar20 = ((pmVar11[uVar38].sleep + L'\x05') * wVar18) / 100 + wVar18;
    bVar60 = uVar30 < 2;
  }
  wVar18 = wVar20;
  if (((((borg_sleep_spell == true) && (pbVar50->awake == true)) &&
       (_Var13 = flag_has_dbg(flags,0xb,0x52,"r_ptr->flags","RF_NO_SLEEP"), !_Var13)) &&
      ((_Var13 = flag_has_dbg(flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var13 &&
       ((int)pbVar50->level <= borg.trait[0x23] + -0xf)))) &&
     ((0x13 < borg.trait[0x23] || (wVar18 = L'\0', borg.trait[0x1c] / 2 <= borg.trait[0x1b])))) {
    wVar18 = wVar20 / (iVar49 + 2);
  }
  if ((borg_crush_spell == true) &&
     (((int)pbVar50->injury * (int)pbVar50->power) / 100 < borg.trait[0x23] * 4)) {
    wVar18 = L'\0';
  }
  wVar20 = wVar18 / 2;
  if (pbVar50->confused == false) {
    wVar20 = wVar18;
  }
  if (pbVar50->stunned == true) {
    wVar20 = (wVar20 * 10) / 0xd;
  }
  wVar18 = wVar20;
  if ((((borg_confuse_spell == true) && (((~pbVar50->awake | pbVar50->confused) & 1U) == 0)) &&
      (_Var13 = flag_has_dbg(flags,0xb,0x52,"r_ptr->flags","RF_NO_SLEEP"), !_Var13)) &&
     (((_Var13 = flag_has_dbg(flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var13 &&
       ((int)pbVar50->level <= borg.trait[0x23] + -0xf)) &&
      ((0x13 < borg.trait[0x23] || (wVar18 = L'\0', borg.trait[0x1c] / 2 <= borg.trait[0x1b])))))) {
    wVar18 = wVar20 / (iVar49 + 2);
  }
  wVar20 = L'\0';
  if (borg_fear_mon_spell == false) {
    wVar20 = wVar18;
  }
  local_124 = wVar20;
  if ((10 < (int)uVar56 && bVar60 == false) &&
     (_Var13 = flag_has_dbg(flags,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE"), !_Var13)) {
    local_124 = L'\0';
    for (lVar59 = 0; pcVar10 = cave, lVar59 != 8; lVar59 = lVar59 + 1) {
      lVar51 = (long)ddy_ddd[lVar59] + (long)y_00;
      lVar55 = (long)ddx_ddd[lVar59] + (long)wVar28;
      wVar54 = (wchar_t)lVar55;
      wVar18 = (wchar_t)lVar51;
      lVar29 = (loc)loc(wVar54,wVar18);
      _Var13 = square_in_bounds_fully(pcVar10,lVar29);
      if ((_Var13) && (borg_grids[lVar51][lVar55].kill == '\0')) {
        bVar48 = borg_grids[lVar51][lVar55].feat;
        if (bVar48 - 0x10 < 6) {
          _Var13 = flag_has_dbg(flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
          if ((_Var13) && (wVar21 = borg_distance(wVar18,wVar54,y,x), wVar21 == L'\x01')) {
            local_124 = wVar20;
          }
          _Var13 = flag_has_dbg(flags,0xb,0x2f,"r_ptr->flags","RF_KILL_WALL");
          if ((_Var13) && (wVar21 = borg_distance(wVar18,wVar54,y,x), wVar21 == L'\x01')) {
            local_124 = wVar20;
          }
        }
        else if ((bVar48 == 2) || (bVar48 == 0x16)) goto LAB_001f3d69;
        wVar21 = borg_distance(wVar18,wVar54,y,x);
        if ((wVar21 < L'\x02') && (_Var13 = borg_cave_floor_bold(wVar18,wVar54), _Var13)) {
          local_124 = (local_f4 / (uint)(iVar49 * 10)) * wVar20;
        }
      }
LAB_001f3d69:
    }
  }
  pbVar58 = borg_kills;
  pmVar12 = r_info;
  if ((10 < (int)uVar56 & bVar60) == 1) {
    local_124 = (local_124 * uVar56) / 10;
  }
  bVar62 = false;
  wVar20 = local_124;
  if ((int)uVar56 < 0xb) {
    wVar20 = L'\0';
  }
  if (uVar30 < 2) {
    wVar20 = local_124;
  }
  uVar2 = borg_kills[i].r_idx;
  bVar63 = true;
  if (borg.temp.prot_from_evil == true) {
    _Var13 = flag_has_dbg(r_info[uVar2].flags,0xb,0x3d,"r_ptr->flags","RF_EVIL");
    if (_Var13) {
      bVar63 = borg.trait[0x23] < pmVar12[uVar2].level;
      bVar62 = pmVar12[uVar2].level <= borg.trait[0x23];
    }
    else {
      bVar62 = false;
    }
  }
  pbVar58 = pbVar58 + i;
  if (borg_on_glyph == false) {
    if (track_glyph.num == 0) {
      bVar6 = false;
    }
    else {
      uVar57 = 0;
      uVar35 = 0;
      if (0 < track_glyph.num) {
        uVar35 = track_glyph.num;
      }
      bVar6 = false;
      for (; uVar35 != uVar57; uVar57 = uVar57 + 1) {
        if ((track_glyph.y[uVar57] == y) && (track_glyph.x[uVar57] == x)) {
          bVar6 = true;
        }
      }
    }
  }
  else {
    bVar6 = true;
  }
  iVar36 = 1000;
  if ((pbVar58->r_idx != 0) && ((int)(uint)pbVar58->r_idx < (int)(z_info->r_max - 1))) {
    bVar48 = pbVar58->ranged_attack;
    if (bVar48 == 0) {
      iVar36 = 0;
    }
    else {
      iVar47 = (int)(pbVar58->power / 3);
      iVar36 = 0x640;
      if (iVar47 < 0x640) {
        iVar36 = iVar47;
      }
      iVar45 = (int)(pbVar58->power / 6);
      iVar32 = 200;
      if (iVar45 < 200) {
        iVar32 = iVar45;
      }
      iVar19 = 0x96;
      if (iVar45 < 0x96) {
        iVar19 = iVar45;
      }
      iVar46 = 500;
      if (iVar45 < 500) {
        iVar46 = iVar45;
      }
      uVar31 = iVar46 * 6;
      uVar35 = (short)uVar31 >> 0xf;
      sVar15 = (short)((int)((uint)uVar35 << 0x10 | uVar31 & 0xffff) / 9);
      iVar4 = 200;
      if (iVar47 < 200) {
        iVar4 = iVar47;
      }
      iVar44 = 0x96;
      if (iVar47 < 0x96) {
        iVar44 = iVar47;
      }
      iVar22 = 400;
      if (iVar45 < 400) {
        iVar22 = iVar45;
      }
      sVar16 = (short)((int)((uint)uVar35 << 0x10 | uVar31 & 0xffff) / 10);
      iVar23 = 600;
      if (iVar45 < 600) {
        iVar23 = iVar45;
      }
      iVar45 = 800;
      if (iVar47 < 800) {
        iVar45 = iVar47;
      }
      iVar47 = 0;
      if (uVar30 < 4) {
        iVar47 = 100;
      }
      iVar33 = 0;
      if (uVar30 < 3) {
        iVar33 = 100;
      }
      iVar24 = (int)(short)((int)((uint)(ushort)((short)(iVar36 + 2U) >> 0xf) << 0x10 |
                                 iVar36 + 2U & 0xffff) / 3);
      iVar52 = 1;
      uVar57 = 0;
      iVar25 = 0;
      iVar37 = 0;
      bVar5 = false;
      while( true ) {
        iVar39 = 100;
        if (bVar48 <= uVar57) break;
        iVar42 = 0;
        iVar41 = 0;
        iVar53 = 0;
        iVar27 = 0x32;
        iVar40 = 0x28;
        iVar34 = 9;
        iVar26 = 0;
        iVar43 = 0;
        cVar7 = borg.temp.res_cold;
        cVar8 = borg.temp.res_fire;
        cVar9 = borg.temp.res_elec;
        switch(pbVar58->spell[uVar57]) {
        case '\x01':
        case 'H':
          iVar53 = 0;
          iVar27 = 5;
          break;
        case '\x02':
          iVar53 = iVar33;
          iVar27 = 0;
          break;
        case '\x03':
          iVar53 = iVar47;
          iVar27 = 0;
          break;
        case '\x04':
          iVar26 = (pmVar12[uVar2].spell_power / 8) * 5 + 5;
          goto switchD_001f4188_caseD_1b;
        case '\x05':
          iVar26 = (pmVar12[uVar2].spell_power / 8) * 6 + 6;
          goto switchD_001f4188_caseD_1b;
        case '\x06':
          iVar26 = (pmVar12[uVar2].spell_power / 8) * 7 + 7;
          goto switchD_001f4188_caseD_1b;
        case '\a':
          iVar26 = iVar42;
          if (borg.trait[0x41] != 0) goto switchD_001f4188_caseD_1b;
          iVar53 = iVar24;
          if (borg.trait[0x48] == 0) {
            iVar53 = iVar36;
          }
          iVar27 = 0x28;
          if (borg.temp.res_acid != true) break;
LAB_001f5965:
          iVar53 = (iVar53 + 2) / 3;
          iVar27 = 0x28;
          break;
        case '\b':
          iVar26 = iVar42;
          if (borg.trait[0x43] != 0) goto switchD_001f4188_caseD_1b;
          iVar43 = iVar24;
          if (borg.trait[0x47] == 0) {
            iVar43 = iVar36;
          }
          if (borg.temp.res_elec != true) goto switchD_001f4188_caseD_44;
LAB_001f58ea:
          iVar53 = (iVar43 + 2) / 3;
          iVar27 = 0x14;
          break;
        case '\t':
          iVar26 = iVar42;
          if (borg.trait[0x40] != 0) goto switchD_001f4188_caseD_1b;
          iVar53 = iVar24;
          if (borg.trait[0x45] == 0) {
            iVar53 = iVar36;
          }
joined_r0x001f5963:
          iVar27 = 0x28;
          if (cVar8 == '\x01') goto LAB_001f5965;
          break;
        case '\n':
          iVar26 = iVar42;
          if (borg.trait[0x42] == 0) {
            iVar43 = iVar24;
            if (borg.trait[0x46] == 0) {
              iVar43 = iVar36;
            }
joined_r0x001f58e8:
            if (cVar7 == '\x01') goto LAB_001f58ea;
            goto switchD_001f4188_caseD_44;
          }
          goto switchD_001f4188_caseD_1b;
        case '\v':
          iVar26 = (int)(short)((int)((uint)(ushort)((short)(iVar45 + 2U) >> 0xf) << 0x10 |
                                     iVar45 + 2U & 0xffff) / 3);
          if (borg.trait[0x49] == 0) {
            iVar26 = iVar45;
          }
          if (borg.temp.res_pois == true) {
LAB_001f57a4:
            iVar26 = iVar26 + 2;
            iVar34 = 3;
            goto LAB_001f57ad;
          }
          iVar39 = 0;
          bVar61 = borg.trait[0x49] == 0;
          iVar27 = 0x14;
LAB_001f4f70:
          iVar53 = iVar26;
          if (!bVar61) {
            iVar27 = iVar39;
          }
          break;
        case '\f':
          bVar61 = borg.trait[0x52] == 0;
          iVar27 = 0x7d;
          if (!bVar61) {
            iVar27 = 0;
          }
          goto LAB_001f4e25;
        case '\r':
          if (borg.trait[0x4b] == 0) goto LAB_001f5176;
LAB_001f511a:
          iVar53 = (iVar46 * 2) / 3;
          iVar27 = 0;
          break;
        case '\x0e':
          if (borg.trait[0x4c] != 0) goto LAB_001f511a;
LAB_001f5176:
          if (borg.trait[0x4d] == 0) {
            iVar40 = 0x14;
            iVar53 = iVar46;
            if (borg.trait[0x19] == 1) {
              iVar40 = 0x28;
            }
          }
          else {
            iVar40 = 0;
            iVar53 = iVar46;
          }
          goto LAB_001f5976;
        case '\x0f':
          if (borg.trait[0x4f] == 0) {
            iVar39 = iVar46 + 500;
            if (borg.trait[0x75] == 0) {
              iVar39 = iVar46;
            }
            iVar53 = iVar39 + 1000;
LAB_001f57e1:
            if (borg.trait[0x76] == 0) {
              iVar53 = iVar39;
            }
          }
          else {
            iVar53 = (int)(short)((int)((uint)(ushort)((short)(iVar46 * 5) >> 0xf) << 0x10 |
                                       iVar46 * 5 & 0xffffU) / 9);
            iVar27 = 0;
          }
          break;
        case '\x10':
          bVar61 = borg.trait[0x53] == 0;
          iVar27 = 100;
          if (bVar61) {
            iVar27 = 300;
          }
LAB_001f4e25:
          iVar53 = (int)(short)((int)((uint)(ushort)((short)(iVar23 * 6) >> 0xf) << 0x10 |
                                     iVar23 * 6 & 0xffffU) / 9);
          if (bVar61) {
            iVar53 = iVar23;
          }
          break;
        case '\x11':
          bVar61 = borg.trait[0x54] == 0;
          iVar27 = 500;
          sVar17 = sVar16;
          if (!bVar61) {
            iVar27 = 0;
          }
          goto LAB_001f524a;
        case '\x12':
          iVar53 = iVar22;
          iVar27 = 100;
          if (borg.trait[0x51] != 0) {
            iVar53 = (int)(short)((int)((uint)(ushort)((short)(iVar22 * 6) >> 0xf) << 0x10 |
                                       iVar22 * 6 & 0xffffU) / 10);
            iVar27 = 0;
          }
          break;
        case '\x13':
          iVar53 = iVar44;
          iVar27 = 0xfa;
          break;
        case '\x14':
          iVar53 = iVar32;
          iVar27 = iVar39;
          break;
        case '\x15':
          iVar53 = iVar4;
          iVar27 = iVar39;
          if (borg.trait[0x4f] == 0) {
            iVar26 = iVar4 + 500;
            if (borg.trait[0x75] == 0) {
              iVar26 = iVar4;
            }
LAB_001f5806:
            iVar53 = iVar26 + 1000;
            iVar27 = iVar39;
            if (borg.trait[0x76] == 0) {
              iVar53 = iVar26;
            }
          }
          break;
        case '\x16':
          bVar61 = borg.trait[0x50] == 0;
          iVar27 = 0x32;
          sVar17 = sVar15;
          if (!bVar61) {
            iVar27 = 0;
          }
LAB_001f524a:
          iVar53 = (int)sVar17;
          if (bVar61) {
            iVar53 = iVar46;
          }
          break;
        case '\x17':
          if (borg.trait[0x4f] == 0) {
            iVar26 = iVar19 + 500;
            if (borg.trait[0x75] == 0) {
              iVar26 = iVar19;
            }
            goto LAB_001f5806;
          }
          iVar53 = iVar19;
          iVar27 = 0;
          break;
        case '\x18':
          if (borg.trait[0x4f] == 0) {
            iVar39 = iVar32 + 100;
            if (borg.trait[0x75] == 0) {
              iVar39 = iVar32;
            }
            iVar53 = iVar39 + 500;
            goto LAB_001f57e1;
          }
          iVar53 = iVar32;
          iVar27 = 0;
          break;
        case '\x19':
          iVar53 = iVar36;
          iVar27 = 0;
          break;
        case '\x1a':
          iVar53 = (pmVar12[uVar2].spell_power / 7) * 0xc;
          goto LAB_001f52f8;
        default:
          goto switchD_001f4188_caseD_1b;
        case '\x1c':
          iVar26 = iVar42;
          if (borg.trait[0x41] == 0) {
            if (borg.trait[0x48] == 0) {
              iVar53 = pmVar12[uVar2].spell_power * 3 + 0xf;
              cVar8 = borg.temp.res_acid;
            }
            else {
              iVar53 = (pmVar12[uVar2].spell_power * 3 + 0x11) / 3;
              cVar8 = borg.temp.res_acid;
            }
            goto joined_r0x001f5963;
          }
          goto switchD_001f4188_caseD_1b;
        case '\x1d':
          iVar26 = iVar42;
          if (borg.trait[0x43] == 0) {
            iVar39 = (pmVar12[uVar2].spell_power * 3) / 2;
            if (borg.trait[0x47] == 0) {
              iVar43 = iVar39 + 8;
              cVar7 = borg.temp.res_elec;
            }
            else {
              iVar43 = (iVar39 + 10) / 3;
              cVar7 = borg.temp.res_elec;
            }
            goto joined_r0x001f58e8;
          }
          goto switchD_001f4188_caseD_1b;
        case '\x1e':
          iVar26 = iVar42;
          if (borg.trait[0x40] == 0) {
            iVar39 = (pmVar12[uVar2].spell_power * 7) / 2;
            if (borg.trait[0x45] == 0) {
              iVar53 = iVar39 + 10;
            }
            else {
              iVar53 = (iVar39 + 0xc) / 3;
            }
            goto joined_r0x001f5963;
          }
          goto switchD_001f4188_caseD_1b;
        case '\x1f':
          iVar26 = iVar42;
          if (borg.trait[0x42] == 0) {
            iVar39 = (pmVar12[uVar2].spell_power * 3) / 2;
            if (borg.trait[0x46] == 0) {
              iVar43 = iVar39 + 10;
            }
            else {
              iVar43 = (iVar39 + 0xc) / 3;
            }
            goto joined_r0x001f58e8;
          }
          goto switchD_001f4188_caseD_1b;
        case ' ':
          iVar39 = pmVar12[uVar2].spell_power / 2;
          if (borg.trait[0x49] == 0) {
            iVar26 = iVar39 * 4 + 0xc;
          }
          else {
            iVar26 = (iVar39 * 4 + 0xe) / 3;
          }
          if (borg.temp.res_pois == true) goto LAB_001f57a4;
          iVar53 = iVar26;
          iVar27 = 0x14;
          if (borg.trait[0x49] != 0) {
            iVar27 = 0;
          }
          break;
        case '!':
          iVar26 = (pmVar12[uVar2].spell_power * 3) / 2 + 10;
          iVar43 = iVar26;
          if (borg.trait[0x50] != 0) goto LAB_001f53b7;
        case 'D':
        case 'E':
switchD_001f4188_caseD_44:
          iVar53 = iVar43;
          iVar27 = 0x14;
          break;
        case '\"':
          iVar39 = pmVar12[uVar2].spell_power * 4 + 100;
          iVar53 = iVar39 * 6 >> 3;
          if (borg.trait[0x52] == 0) {
            iVar53 = iVar39;
          }
          iVar27 = 0xfa;
          if (borg.trait[0x52] != 0) {
            iVar27 = 0;
          }
          break;
        case '#':
          iVar26 = (pmVar12[uVar2].spell_power * 5) / 2 + 0x32;
          if (borg.trait[0x4f] != 0) goto switchD_001f4188_caseD_1b;
          iVar39 = 500;
          if (borg.trait[0x75] == 0) {
            iVar39 = 0;
          }
          iVar27 = iVar39 + 1000;
          if (borg.trait[0x76] == 0) {
            iVar27 = iVar39;
          }
          iVar53 = iVar26;
          if (borg.trait[0x4e] == 0) {
            iVar39 = iVar27 + 0x32;
            iVar27 = iVar27 + 0x46;
            bVar61 = borg.trait[0x19] == 1;
            goto LAB_001f4f70;
          }
          break;
        case '$':
          iVar53 = pmVar12[uVar2].spell_power * 5 + 100;
          break;
        case '%':
          iVar53 = ((pmVar12[uVar2].spell_power * 3) / 2 + 1) / 2 + 10;
          break;
        case '&':
          iVar26 = pmVar12[uVar2].spell_power * 4 + 100;
          if (borg.trait[0x4c] != 0) goto LAB_001f53b7;
LAB_001f4d51:
          if (borg.trait[0x4d] != 0) goto switchD_001f4188_caseD_1b;
          iVar53 = iVar26;
          iVar27 = 0x14;
          if (borg.trait[0x19] == 1) {
            iVar27 = 0x28;
          }
          break;
        case '\'':
          iVar26 = (pmVar12[uVar2].spell_power * 3) / 2 + 10;
          if (borg.trait[0x4b] == 0) goto LAB_001f4d51;
LAB_001f53b7:
          iVar26 = iVar26 * 6;
LAB_001f57ad:
          iVar53 = iVar26 / iVar34;
          iVar27 = 0;
          break;
        case '(':
          iVar26 = pmVar12[uVar2].spell_power * 5 + 0x46;
          if (borg.trait[0x4f] != 0) goto switchD_001f4188_caseD_1b;
          iVar39 = 500;
          if (borg.trait[0x75] == 0) {
            iVar39 = 0;
          }
          iVar53 = iVar26;
          iVar27 = iVar39 + 1000;
          if (borg.trait[0x76] == 0) {
            iVar27 = iVar39;
          }
          break;
        case ')':
          iVar53 = iVar41;
          iVar27 = borg.trait[0x1f];
          if (borg.trait[0x1f] != 0) {
            iVar27 = iVar39;
          }
          break;
        case '*':
          iVar26 = iVar42;
          if (borg.trait[0x39] < 100) {
            iVar26 = pmVar12[uVar2].spell_power / 2 + 1;
          }
          goto switchD_001f4188_caseD_1b;
        case '+':
          iVar39 = borg.trait[0x39] * -2 + 200;
          iVar27 = 0;
          if (0 < iVar39) {
            iVar27 = iVar39;
          }
          iVar53 = 0x60;
          break;
        case ',':
          iVar26 = iVar42;
          if (borg.trait[0x39] < 100) {
            iVar26 = ((0x78 - borg.trait[0x39]) * (pmVar12[uVar2].spell_power / 3) * 10) / 100;
          }
          goto switchD_001f4188_caseD_1b;
        case '-':
          if (borg.trait[0x41] == 0) {
            iVar53 = pmVar12[uVar2].spell_power / 3;
            if (borg.trait[0x48] == 0) {
              iVar53 = iVar53 + 0x38;
            }
            else {
              iVar53 = (iVar53 + 0x3a) / 3;
            }
            if (borg.temp.res_acid != true) goto LAB_001f5981;
LAB_001f5a26:
            iVar53 = (iVar53 + 2) / 3;
            goto LAB_001f5981;
          }
          iVar53 = 0;
          goto LAB_001f5423;
        case '.':
          iVar26 = iVar42;
          if (borg.trait[0x43] != 0) goto switchD_001f4188_caseD_1b;
          iVar53 = pmVar12[uVar2].spell_power / 3;
          if (borg.trait[0x47] == 0) {
            iVar53 = iVar53 + 0x20;
          }
          else {
            iVar53 = (iVar53 + 0x22) / 3;
          }
          iVar40 = 0x14;
joined_r0x001f5a20:
          if (cVar9 == '\x01') goto LAB_001f5a26;
          goto LAB_001f5981;
        case '/':
          iVar26 = iVar42;
          if (borg.trait[0x40] == 0) {
            iVar53 = pmVar12[uVar2].spell_power / 3;
            cVar9 = borg.temp.res_fire;
            if (borg.trait[0x45] == 0) {
              iVar53 = iVar53 + 0x48;
            }
            else {
              iVar53 = (iVar53 + 0x4a) / 3;
            }
            goto joined_r0x001f5a20;
          }
          goto switchD_001f4188_caseD_1b;
        case '0':
          iVar26 = iVar42;
          if (borg.trait[0x42] == 0) {
            iVar53 = pmVar12[uVar2].spell_power / 3;
            if (borg.trait[0x46] == 0) {
              iVar53 = iVar53 + 0x30;
            }
            else {
              iVar53 = (iVar53 + 0x32) / 3;
            }
            iVar40 = 0x14;
            cVar9 = borg.temp.res_cold;
            goto joined_r0x001f5a20;
          }
          goto switchD_001f4188_caseD_1b;
        case '1':
          iVar26 = iVar42;
          if (borg.trait[0x44] == 0) {
            iVar53 = pmVar12[uVar2].spell_power / 3;
            if (borg.trait[0x49] == 0) {
              iVar53 = iVar53 + 0x48;
            }
            else {
              iVar53 = (iVar53 + 0x4a) / 3;
            }
            iVar40 = 0;
            cVar9 = borg.temp.res_pois;
            goto joined_r0x001f5a20;
          }
          goto switchD_001f4188_caseD_1b;
        case '2':
          iVar53 = (pmVar12[uVar2].spell_power * 3) / 2 + 0x4b;
          if (borg.trait[0x52] == 0) {
            iVar40 = 200;
          }
          else {
            iVar53 = (iVar53 * 6) / 8;
            iVar40 = 0;
          }
          goto LAB_001f5981;
        case '3':
          iVar53 = pmVar12[uVar2].spell_power + L'd';
          if (borg.trait[0x4f] != 0) goto LAB_001f5423;
          iVar39 = 500;
          if (borg.trait[0x75] == 0) {
            iVar39 = 0;
          }
          iVar26 = iVar39 + 1000;
          if (borg.trait[0x76] == 0) {
            iVar26 = iVar39;
          }
          iVar40 = iVar26;
          if (borg.trait[0x4e] == 0) {
            iVar40 = iVar26 + 0x28;
            if (borg.trait[0x19] != 1) {
              iVar40 = iVar26 + 0x14;
            }
          }
          goto LAB_001f5981;
        case '4':
          iVar40 = 0x32;
          iVar53 = (pmVar12[uVar2].spell_power * 5) / 2 + 0x32;
          goto LAB_001f5981;
        case '5':
          iVar53 = pmVar12[uVar2].spell_power + L'B';
          iVar39 = 0;
          iVar40 = 0;
          if (borg.trait[0x4f] == 0) {
            iVar26 = pmVar12[uVar2].spell_power + L'ȶ';
LAB_001f51ba:
            if (borg.trait[0x75] == 0) {
              iVar26 = iVar53;
            }
            iVar40 = iVar39;
            iVar53 = iVar26 + 1000;
            if (borg.trait[0x76] == 0) {
              iVar53 = iVar26;
            }
          }
          goto LAB_001f5981;
        case '6':
          iVar53 = pmVar12[uVar2].spell_power + L'$';
          iVar39 = 0x14;
          iVar40 = iVar39;
          if (borg.trait[0x4f] == 0) {
            iVar26 = pmVar12[uVar2].spell_power + L'V';
            goto LAB_001f51ba;
          }
          goto LAB_001f5981;
        case '7':
          iVar53 = pmVar12[uVar2].spell_power / 3;
LAB_001f52f8:
          iVar53 = iVar53 + 0xc;
LAB_001f5423:
          iVar40 = 0;
          goto LAB_001f5981;
        case '8':
          iVar26 = iVar42;
          if (borg.trait[0x43] == 0) {
            if (borg.trait[0x47] == 0) {
              iVar53 = pmVar12[uVar2].spell_power * 2 + 0x37;
            }
            else {
              iVar53 = (pmVar12[uVar2].spell_power * 2 + 0x39) / 3;
            }
            iVar40 = 0;
            goto joined_r0x001f5a20;
          }
          goto switchD_001f4188_caseD_1b;
        case '9':
          iVar53 = pmVar12[uVar2].spell_power * 2 + 0x37;
          iVar40 = 0;
          if (borg.trait[0x52] != 0) {
            iVar53 = (iVar53 * 6) / 8;
            iVar40 = 0;
          }
          goto LAB_001f5981;
        case ':':
          goto LAB_001f553d;
        case ';':
          iVar39 = borg.trait[0x4d];
          goto joined_r0x001f52a6;
        case '<':
          iVar39 = borg.trait[0x4e];
joined_r0x001f52a6:
          iVar26 = iVar42;
          if (iVar39 != 0) goto switchD_001f4188_caseD_1b;
LAB_001f553d:
          iVar39 = borg.trait[0x39];
          iVar27 = 10;
LAB_001f5549:
          iVar53 = 0;
          if (99 < iVar39) {
            iVar27 = 0;
          }
          break;
        case '=':
          iVar26 = iVar42;
          if (borg.trait[0x56] != 0) goto switchD_001f4188_caseD_1b;
          iVar53 = iVar41;
          iVar27 = (uint)(borg.trait[0x39] < 100) * 5;
          break;
        case '>':
          iVar26 = iVar42;
          if (borg.trait[0x56] == 0) {
            iVar39 = borg.trait[0x39];
            iVar27 = 0x96;
            goto LAB_001f5549;
          }
switchD_001f4188_caseD_1b:
          iVar53 = iVar26;
          iVar27 = 0;
          break;
        case '?':
        case '@':
        case 'C':
        case 'F':
          iVar53 = iVar41;
          iVar27 = 10;
          break;
        case 'G':
          iVar39 = borg.trait[0x39];
          iVar27 = 0x32;
          goto LAB_001f5549;
        case 'I':
          break;
        case 'J':
          if (99 < borg.trait[0x39]) goto switchD_001f4188_caseD_1b;
          iVar53 = iVar41;
          iVar27 = 0x1e;
          if (borg.trait[0x1e] < 0xf) {
            iVar27 = 500;
          }
          break;
        case 'K':
          iVar27 = 200;
          break;
        case 'L':
          for (iVar39 = -1; iVar39 != 2; iVar39 = iVar39 + 1) {
            for (lVar59 = -1; (int)lVar59 != 2; lVar59 = lVar59 + 1) {
              if (((int)lVar59 != 0 || iVar39 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar58->pos).y + lVar59] +
                                      (long)iVar39 + (long)(pbVar58->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar61 = iVar52 == 7;
                  iVar52 = iVar52 + 1 + (uint)(iVar52 == -1);
                  if (bVar61) {
                    iVar52 = 100;
                  }
                  if (borg_as_position != true) goto LAB_001f44fb;
                }
                iVar52 = 1000;
              }
LAB_001f44fb:
            }
          }
          goto LAB_001f50a3;
        case 'M':
          for (iVar39 = -1; iVar39 != 2; iVar39 = iVar39 + 1) {
            for (lVar59 = -1; (int)lVar59 != 2; lVar59 = lVar59 + 1) {
              if (((int)lVar59 != 0 || iVar39 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar58->pos).y + lVar59] +
                                      (long)iVar39 + (long)(pbVar58->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar61 = iVar52 == 7;
                  iVar52 = iVar52 + 1 + (uint)(iVar52 == -1);
                  if (bVar61) {
                    iVar52 = 100;
                  }
                  if (borg_as_position != true) goto LAB_001f4919;
                }
                iVar52 = 1000;
              }
LAB_001f4919:
            }
          }
          goto LAB_001f54b6;
        case 'N':
          for (iVar39 = -1; iVar39 != 2; iVar39 = iVar39 + 1) {
            for (lVar59 = -1; (int)lVar59 != 2; lVar59 = lVar59 + 1) {
              if (((int)lVar59 != 0 || iVar39 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar58->pos).y + lVar59] +
                                      (long)iVar39 + (long)(pbVar58->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar61 = iVar52 == 7;
                  iVar52 = iVar52 + 1 + (uint)(iVar52 == -1);
                  if (bVar61) {
                    iVar52 = 100;
                  }
                  if (borg_as_position != true) goto LAB_001f5009;
                }
                iVar52 = 1000;
              }
LAB_001f5009:
            }
          }
          if (((bVar6 || bVar62) || (borg_create_door != false)) || (borg_fighting_unique != L'\0'))
          {
            iVar40 = 0;
          }
          else {
            iVar40 = (pmVar12[uVar2].spell_power * 5) / iVar52;
          }
          goto LAB_001f5976;
        case 'O':
          for (iVar39 = -1; iVar39 != 2; iVar39 = iVar39 + 1) {
            for (lVar59 = -1; (int)lVar59 != 2; lVar59 = lVar59 + 1) {
              if (((int)lVar59 != 0 || iVar39 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar58->pos).y + lVar59] +
                                      (long)iVar39 + (long)(pbVar58->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar61 = iVar52 == 7;
                  iVar52 = iVar52 + 1 + (uint)(iVar52 == -1);
                  if (bVar61) {
                    iVar52 = 100;
                  }
                  if (borg_as_position != true) goto LAB_001f4576;
                }
                iVar52 = 1000;
              }
LAB_001f4576:
            }
          }
          iVar27 = 0;
          if (((!bVar6 && !bVar62) && (iVar27 = 0, borg_create_door == false)) &&
             (iVar27 = 0, borg_fighting_unique == L'\0')) {
            wVar18 = pmVar12[uVar2].spell_power * 7;
            goto LAB_001f56d3;
          }
          goto LAB_001f56d9;
        case 'P':
          for (iVar39 = -1; iVar39 != 2; iVar39 = iVar39 + 1) {
            for (lVar59 = -1; (int)lVar59 != 2; lVar59 = lVar59 + 1) {
              iVar53 = iVar52;
              if (((int)lVar59 != 0 || iVar39 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar58->pos).y + lVar59] +
                                      (long)iVar39 + (long)(pbVar58->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  iVar53 = iVar52 + 1 + (uint)(iVar52 == -1);
                  if (iVar52 == 7) {
                    iVar53 = 100;
                  }
                  if (borg_as_position != true) goto LAB_001f5619;
                }
                iVar53 = 1000;
              }
LAB_001f5619:
              iVar52 = iVar53;
            }
          }
          goto LAB_001f5622;
        case 'Q':
          for (iVar39 = -1; iVar39 != 2; iVar39 = iVar39 + 1) {
            for (lVar59 = -1; (int)lVar59 != 2; lVar59 = lVar59 + 1) {
              if (((int)lVar59 != 0 || iVar39 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar58->pos).y + lVar59] +
                                      (long)iVar39 + (long)(pbVar58->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar61 = iVar52 == 7;
                  iVar52 = iVar52 + 1 + (uint)(iVar52 == -1);
                  if (bVar61) {
                    iVar52 = 100;
                  }
                  if (borg_as_position != true) goto LAB_001f43fd;
                }
                iVar52 = 1000;
              }
LAB_001f43fd:
            }
          }
          goto LAB_001f5622;
        case 'R':
          for (iVar39 = -1; iVar39 != 2; iVar39 = iVar39 + 1) {
            for (lVar59 = -1; (int)lVar59 != 2; lVar59 = lVar59 + 1) {
              if (((int)lVar59 != 0 || iVar39 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar58->pos).y + lVar59] +
                                      (long)iVar39 + (long)(pbVar58->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar61 = iVar52 == 7;
                  iVar52 = iVar52 + 1 + (uint)(iVar52 == -1);
                  if (bVar61) {
                    iVar52 = 100;
                  }
                  if (borg_as_position != true) goto LAB_001f4b7f;
                }
                iVar52 = 1000;
              }
LAB_001f4b7f:
            }
          }
LAB_001f5622:
          iVar27 = 0;
          if (((!bVar6 && !bVar62) && (iVar27 = 0, borg_create_door == false)) &&
             (iVar27 = 0, borg_fighting_unique == L'\0')) {
            wVar18 = pmVar12[uVar2].spell_power * 5;
            goto LAB_001f56d3;
          }
          goto LAB_001f56d9;
        case 'S':
          for (iVar39 = -1; iVar39 != 2; iVar39 = iVar39 + 1) {
            for (lVar59 = -1; (int)lVar59 != 2; lVar59 = lVar59 + 1) {
              if (((int)lVar59 != 0 || iVar39 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar58->pos).y + lVar59] +
                                      (long)iVar39 + (long)(pbVar58->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar61 = iVar52 == 7;
                  iVar52 = iVar52 + 1 + (uint)(iVar52 == -1);
                  if (bVar61) {
                    iVar52 = 100;
                  }
                  if (borg_as_position != true) goto LAB_001f429d;
                }
                iVar52 = 1000;
              }
LAB_001f429d:
            }
          }
          if (bVar63) {
            if (bVar6) {
              wVar18 = pmVar12[uVar2].spell_power;
            }
            else {
              wVar18 = pmVar12[uVar2].spell_power;
              if ((borg_create_door == false) && (borg_fighting_unique == L'\0')) {
                wVar18 = wVar18 * 5;
                goto LAB_001f56d3;
              }
            }
            wVar18 = wVar18 * 2;
          }
          else {
            wVar18 = pmVar12[uVar2].spell_power;
          }
          goto LAB_001f56d3;
        case 'T':
          for (iVar39 = -1; iVar39 != 2; iVar39 = iVar39 + 1) {
            for (lVar59 = -1; (int)lVar59 != 2; lVar59 = lVar59 + 1) {
              if (((int)lVar59 != 0 || iVar39 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar58->pos).y + lVar59] +
                                      (long)iVar39 + (long)(pbVar58->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar61 = iVar52 == 7;
                  iVar52 = iVar52 + 1 + (uint)(iVar52 == -1);
                  if (bVar61) {
                    iVar52 = 100;
                  }
                  if (borg_as_position != true) goto LAB_001f433d;
                }
                iVar52 = 1000;
              }
LAB_001f433d:
            }
          }
          if ((bool)(borg_fighting_unique != L'\0' | bVar62)) goto LAB_001f54d8;
          if (bVar6) goto LAB_001f50b9;
          wVar18 = pmVar12[uVar2].spell_power;
          if (borg_create_door != true) goto LAB_001f568d;
          goto LAB_001f50c1;
        case 'U':
          for (iVar39 = -1; iVar39 != 2; iVar39 = iVar39 + 1) {
            for (lVar59 = -1; (int)lVar59 != 2; lVar59 = lVar59 + 1) {
              if (((int)lVar59 != 0 || iVar39 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar58->pos).y + lVar59] +
                                      (long)iVar39 + (long)(pbVar58->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar61 = iVar52 == 7;
                  iVar52 = iVar52 + 1 + (uint)(iVar52 == -1);
                  if (bVar61) {
                    iVar52 = 100;
                  }
                  if (borg_as_position != true) goto LAB_001f481f;
                }
                iVar52 = 1000;
              }
LAB_001f481f:
            }
          }
          goto LAB_001f50a3;
        case 'V':
          for (iVar39 = -1; iVar39 != 2; iVar39 = iVar39 + 1) {
            for (lVar59 = -1; (int)lVar59 != 2; lVar59 = lVar59 + 1) {
              if (((int)lVar59 != 0 || iVar39 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar58->pos).y + lVar59] +
                                      (long)iVar39 + (long)(pbVar58->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar61 = iVar52 == 7;
                  iVar52 = iVar52 + 1 + (uint)(iVar52 == -1);
                  if (bVar61) {
                    iVar52 = 100;
                  }
                  if (borg_as_position != true) goto LAB_001f509a;
                }
                iVar52 = 1000;
              }
LAB_001f509a:
            }
          }
          goto LAB_001f50a3;
        case 'W':
          for (iVar39 = -1; iVar39 != 2; iVar39 = iVar39 + 1) {
            for (lVar59 = -1; (int)lVar59 != 2; lVar59 = lVar59 + 1) {
              if (((int)lVar59 != 0 || iVar39 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar58->pos).y + lVar59] +
                                      (long)iVar39 + (long)(pbVar58->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar61 = iVar52 == 7;
                  iVar52 = iVar52 + 1 + (uint)(iVar52 == -1);
                  if (bVar61) {
                    iVar52 = 100;
                  }
                  if (borg_as_position != true) goto LAB_001f447c;
                }
                iVar52 = 1000;
              }
LAB_001f447c:
            }
          }
LAB_001f50a3:
          if (bVar63) {
            if (bVar6) {
LAB_001f50b9:
              wVar18 = pmVar12[uVar2].spell_power;
            }
            else {
              wVar18 = pmVar12[uVar2].spell_power;
              if ((borg_create_door == false) && (borg_fighting_unique == L'\0')) {
LAB_001f568d:
                wVar18 = wVar18 * 7;
                goto LAB_001f56d3;
              }
            }
LAB_001f50c1:
            wVar18 = wVar18 * 3;
          }
          else {
LAB_001f54d8:
            wVar18 = pmVar12[uVar2].spell_power;
          }
LAB_001f56d3:
          iVar27 = wVar18 / iVar52;
LAB_001f56d9:
          _Var13 = flag_has_dbg(r_info->flags,0xb,1,"r_info->flags","RF_UNIQUE");
          iVar53 = 0;
          if (_Var13) {
            iVar53 = 0;
            iVar27 = (iVar27 * 0x4b) / 100;
          }
          break;
        case 'X':
          for (iVar39 = -1; iVar39 != 2; iVar39 = iVar39 + 1) {
            for (lVar59 = -1; (int)lVar59 != 2; lVar59 = lVar59 + 1) {
              if (((int)lVar59 != 0 || iVar39 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar58->pos).y + lVar59] +
                                      (long)iVar39 + (long)(pbVar58->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar61 = iVar52 == 7;
                  iVar52 = iVar52 + 1 + (uint)(iVar52 == -1);
                  if (bVar61) {
                    iVar52 = 100;
                  }
                  if (borg_as_position != true) goto LAB_001f4782;
                }
                iVar52 = 1000;
              }
LAB_001f4782:
            }
          }
          goto LAB_001f54b6;
        case 'Y':
          for (iVar39 = -1; iVar39 != 2; iVar39 = iVar39 + 1) {
            for (lVar59 = -1; (int)lVar59 != 2; lVar59 = lVar59 + 1) {
              if (((int)lVar59 != 0 || iVar39 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar58->pos).y + lVar59] +
                                      (long)iVar39 + (long)(pbVar58->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar61 = iVar52 == 7;
                  iVar52 = iVar52 + 1 + (uint)(iVar52 == -1);
                  if (bVar61) {
                    iVar52 = 100;
                  }
                  if (borg_as_position != true) goto LAB_001f420b;
                }
                iVar52 = 1000;
              }
LAB_001f420b:
            }
          }
          iVar27 = 0;
          if (!bVar63) goto LAB_001f56d9;
          goto LAB_001f54bd;
        case 'Z':
          for (iVar39 = -1; iVar39 != 2; iVar39 = iVar39 + 1) {
            for (lVar59 = -1; (int)lVar59 != 2; lVar59 = lVar59 + 1) {
              if (((int)lVar59 != 0 || iVar39 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar58->pos).y + lVar59] +
                                      (long)iVar39 + (long)(pbVar58->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar61 = iVar52 == 7;
                  iVar52 = iVar52 + 1 + (uint)(iVar52 == -1);
                  if (bVar61) {
                    iVar52 = 100;
                  }
                  if (borg_as_position != true) goto LAB_001f54ad;
                }
                iVar52 = 1000;
              }
LAB_001f54ad:
            }
          }
LAB_001f54b6:
          if (!bVar63) goto LAB_001f54d8;
LAB_001f54bd:
          if (bVar6) {
            wVar18 = pmVar12[uVar2].spell_power;
LAB_001f54d0:
            wVar18 = wVar18 * 6;
          }
          else {
            wVar18 = pmVar12[uVar2].spell_power;
            if ((borg_create_door != false) || (borg_fighting_unique != L'\0')) goto LAB_001f54d0;
            wVar18 = wVar18 * 0xc;
          }
          goto LAB_001f56d3;
        case '[':
          for (iVar39 = -1; lVar59 = -1, iVar39 != 2; iVar39 = iVar39 + 1) {
            for (; (int)lVar59 != 2; lVar59 = lVar59 + 1) {
              if (((int)lVar59 != 0 || iVar39 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar58->pos).y + lVar59] +
                                      (long)iVar39 + (long)(pbVar58->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar61 = iVar52 == 7;
                  iVar52 = iVar52 + 1 + (uint)(iVar52 == -1);
                  if (bVar61) {
                    iVar52 = 100;
                  }
                  if (borg_as_position != true) goto LAB_001f4ac5;
                }
                iVar52 = 1000;
              }
LAB_001f4ac5:
            }
          }
          if (bVar63) {
            if (bVar6) goto LAB_001f50b9;
            wVar18 = pmVar12[uVar2].spell_power;
            if (borg_create_door == true) goto LAB_001f50c1;
            wVar18 = wVar18 * 6;
          }
          else {
            wVar18 = pmVar12[uVar2].spell_power;
          }
          goto LAB_001f56d3;
        }
        iVar40 = iVar27;
LAB_001f5976:
        if (bVar5) {
LAB_001f5981:
          _Var13 = borg_projectable_pure((pbVar58->pos).y,(pbVar58->pos).x,borg.c.y,borg.c.x);
          if (!_Var13) {
            iVar53 = 0;
          }
          bVar5 = true;
        }
        else {
          bVar5 = false;
        }
        if (0x4a < borg.trait[0x6a]) {
          iVar40 = 0;
        }
        iVar40 = iVar40 + iVar53;
        if (iVar25 < iVar40) {
          iVar25 = iVar40;
        }
        iVar37 = iVar40 + iVar37;
        uVar57 = uVar57 + 1;
        bVar48 = pbVar58->ranged_attack;
      }
      uVar30 = 0;
      if (0 < iVar37 - borg.trait[0x2f]) {
        uVar30 = iVar37 - borg.trait[0x2f];
      }
      uVar57 = (ulong)uVar30;
      if ((borg_morgoth_position != false) || (borg_as_position == true)) {
        uVar57 = (ulong)(uVar30 * 7) / 10;
      }
      iVar47 = (int)(uVar57 / bVar48);
      iVar36 = iVar47;
      if (((average) && (iVar36 = iVar25, iVar25 < (int)((uint)(iVar47 * 0xf) / 10))) &&
         (iVar36 = iVar47, (borg.trait[0x1b] << 3) / 10 < iVar25)) {
        iVar36 = iVar25;
      }
    }
  }
  if ((pmVar11[uVar38].freq_innate == L'\0') && (pmVar11[uVar38].freq_spell == L'\0')) {
    iVar36 = 0;
  }
  wVar18 = borg_distance(y_00,wVar28,y,x);
  local_108 = 0;
  if (wVar18 <= (int)(uint)z_info->max_range) {
    local_108 = iVar36;
  }
  if ((((int)uVar56 < 0xb) && (_Var13 = borg_projectable(y_00,wVar28,y,x), !_Var13)) &&
     (_Var13 = borg_projectable(y,x,y_00,wVar28), !_Var13)) {
    local_108 = 0;
  }
  if (0x13 < (int)local_f4) {
    iVar36 = (int)(local_108 * local_f4) / 10;
    local_f4 = 0x14;
    local_108 = 0;
    for (lVar59 = 0; pcVar10 = cave, lVar59 != 8; lVar59 = lVar59 + 1) {
      lVar51 = (long)ddy_ddd[lVar59] + (long)y_00;
      lVar55 = (long)ddx_ddd[lVar59] + (long)wVar28;
      wVar54 = (wchar_t)lVar55;
      wVar18 = (wchar_t)lVar51;
      lVar29 = (loc)loc(wVar54,wVar18);
      _Var13 = square_in_bounds_fully(pcVar10,lVar29);
      if (((_Var13) && (borg_grids[lVar51][lVar55].kill == '\0')) &&
         ((bVar48 = borg_grids[lVar51][lVar55].feat, bVar48 != 2 && (bVar48 != 0x16)))) {
        if (0xf < bVar48) {
          _Var13 = flag_has_dbg(flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
          if ((_Var13) && (_Var13 = borg_projectable(wVar18,wVar54,y,x), _Var13)) {
            local_108 = iVar36;
          }
          _Var13 = flag_has_dbg(flags,0xb,0x2f,"r_ptr->flags","RF_KILL_WALL");
          if (!_Var13) goto LAB_001f5d57;
        }
        _Var13 = borg_projectable(wVar18,wVar54,y,x);
        if (_Var13) {
          local_108 = iVar36;
        }
      }
LAB_001f5d57:
    }
  }
  iVar36 = local_108;
  if (25000 < borg_t) {
    iVar36 = local_108 / 5;
  }
  if (0x4b0 < borg.time_this_panel) {
    iVar36 = local_108 / 5;
  }
  _Var13 = flag_has_dbg(flags,0xb,0x11,"r_ptr->flags","RF_MULTIPLY");
  if ((_Var13) && (borg.trait[0x23] < 0x14)) {
    iVar36 = iVar36 + (iVar36 * 0xc) / 10;
  }
  if (((pmVar11[uVar38].friends != (monster_friends *)0x0) ||
      (pmVar11[uVar38].friends_base != (monster_friends_base *)0x0)) && (borg.trait[0x23] < 0x14)) {
    iVar36 = iVar36 + (iVar36 * 0xc) / 10;
  }
  if (pbVar50->awake == true) {
    if ((((borg_sleep_spell_ii & bVar60) != 0) &&
        (_Var13 = flag_has_dbg(flags,0xb,0x52,"r_ptr->flags","RF_NO_SLEEP"), !_Var13)) &&
       (_Var13 = flag_has_dbg(flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var13)) {
      iVar47 = borg.trait[0x23];
      iVar32 = (iVar47 - 10U >> 2) * 3 + 10;
      if (iVar47 < 0xf) {
        iVar32 = iVar47;
      }
      if (pbVar50->level <= iVar32) {
        iVar36 = iVar36 / 3;
      }
    }
  }
  else {
    iVar47 = iVar36 / 2;
    if (borg.trait[0x23] < 0x19) {
      iVar47 = iVar36;
    }
    iVar36 = ((pmVar11[uVar38].sleep + L'\x05') * iVar47) / 100 + iVar47;
  }
  if ((borg_crush_spell == true) &&
     (((int)pbVar50->injury * (int)pbVar50->power) / 100 < borg.trait[0x23] * 4)) {
    iVar36 = 0;
  }
  if (borg_sleep_spell == true) {
    iVar36 = iVar36 / (iVar49 + 2);
  }
  iVar49 = iVar36 / 2;
  if (pbVar50->confused == false) {
    iVar49 = iVar36;
  }
  if (pbVar50->stunned == true) {
    iVar49 = (iVar49 * 10) / 0xd;
  }
  iVar36 = iVar49 / 6;
  if (borg_confuse_spell == false) {
    iVar36 = iVar49;
  }
  if (!full_damage) {
    uVar56 = pmVar11[uVar38].freq_spell + pmVar11[uVar38].freq_innate;
    if ((int)uVar56 < 0x16) {
      iVar36 = iVar36 << 2;
    }
    else if (uVar56 < 0x34) {
      iVar36 = iVar36 * 6;
    }
    else {
      if (0x65 < uVar56) goto LAB_001f5fab;
      iVar36 = iVar36 << 3;
    }
    iVar36 = iVar36 / 10;
  }
LAB_001f5fab:
  if (iVar36 == 0) {
    wVar28 = L'\0';
  }
  else {
    wVar28 = (int)(iVar36 * local_f4) / 10;
  }
  if (wVar28 < wVar20) {
    wVar28 = wVar20;
  }
  if (L'ߏ' < wVar28) {
    wVar28 = L'ߐ';
  }
  return wVar28;
}

Assistant:

int borg_danger_one_kill(
    int y, int x, int c, int i, bool average, bool full_damage)
{
    borg_kill *kill            = &borg_kills[i];

    struct monster_race *r_ptr = &r_info[kill->r_idx];

    int x9                     = kill->pos.x;
    int y9                     = kill->pos.y;
    int y_temp, x_temp;

    int ax, ay, d;

    int q = 0, r, p, v1 = 0, v2 = 0, b_v2 = 0, b_v1 = 0;

    int fake_speed    = borg.trait[BI_SPEED];
    int monster_speed = kill->speed;
    int t, e;

    int ii;
    int chance;

    /* Paranoia */
    if (!kill->r_idx)
        return 0;

    /* "player ghosts" */
    if (kill->r_idx >= z_info->r_max - 1)
        return 100;

    /* Skip certain monster indexes.
     * These have been listed mainly in Teleport Other
     * checks in borg6.c in the defense maneuvers.
     */
    if (borg_tp_other_n) {
        for (ii = 0; ii <= borg_tp_other_n; ii++) {
            /* Is the current danger check same as a saved monster index? */
            if (i == borg_tp_other_index[ii]) {
                return 0;
            }
        }
    }

    /* Distance components */
    ax = (x9 > x) ? (x9 - x) : (x - x9);
    ay = (y9 > y) ? (y9 - y) : (y - y9);

    /* Distance */
    d = MAX(ax, ay);

    /* Minimal distance */
    if (d < 1)
        d = 1;

    /* Minimal distance */
    if (d > 20)
        return 0;

    /* A very speedy borg will miscalculate danger of some monsters */
    if (borg.trait[BI_SPEED] >= 135)
        fake_speed = (borg_fighting_unique ? 120 : 125);

    /* Consider the character haste and slow monster spells */
    if (borg.temp.fast)
        fake_speed += 10;
    if (borg_slow_spell)
        monster_speed -= 10;

    /* Assume monsters are a little fast when you are low level */
    if (borg.trait[BI_MAXHP] < 20 && borg.trait[BI_CDEPTH])
        monster_speed += 3;

    /* Player energy per game turn  */
    e = extract_energy[(fake_speed)];

    /* Game turns per player move  */
    t = (100 + (e - 1)) / e;

    /*  Monster energy per game turn  */
    e = extract_energy[monster_speed];

    /* Monster moves */
    q = c * ((t * e) / 10);

    /* allow partial hits when not calculating full possible damage */
    if (full_damage)
        q = (int)((q + 9) / 10) * 10;

    /* Minimal energy.  Monsters get at least some energy.
     * If the borg is very fast relative to a monster, then the
     * monster danger is artificially low due to the way the borg
     * will calculate the danger and energy.  So the monsters must
     * be given some base energy to equate the borg's.
     * ie:  the borg with speed +40 (speed = 150) is attacking
     * a monster with normal speed (speed = 110).  One would
     * think that the borg gets 4 attacks per turn over the monster.
     * and this does happen.  What if the monster can deal out
     * 1000 damage pts per monster attack turn?  The borg will
     * reduce the danger to 250 because the borg is 4x faster
     * than the monster.  But eventually the borg will get hit
     * by that 1000 pt damage attack.  And when it does, its
     * going to hurt.
     * So we make sure the monster is at least as fast as us.
     * But the monster is allowed to be faster than us.
     */
    if (q <= 10)
        q = 10;

    /** Danger from physical attacks **/

    /* Physical attacks */
    v1 = borg_danger_physical(i, full_damage);

    /* Hack -- Under Stressful Situation.
     */
    if (borg.time_this_panel > 1200 || borg_t > 25000) {
        /* he might be stuck and could overflow */
        v1 = v1 / 5;
    }

    /* No attacks for some monsters */
    if (rf_has(r_ptr->flags, RF_NEVER_BLOW)) {
        v1 = 0;
    }

    /* No movement for some monsters */
    if ((rf_has(r_ptr->flags, RF_NEVER_MOVE)) && (d > 1)) {
        v1 = 0;
    }

    /* multipliers yeild some trouble when I am weak */
    if ((rf_has(r_ptr->flags, RF_MULTIPLY))
        && (borg.trait[BI_CLEVEL] < 20)) { /* extra 50% */
        v1 = v1 + (v1 * 15 / 10);
    }

    /* Friends yeild some trouble when I am weak */
    if ((r_ptr->friends || r_ptr->friends_base)
        && (borg.trait[BI_CLEVEL] < 20)) {
        if (borg.trait[BI_CLEVEL] < 15) {
            /* extra 80% */
            v1 = v1 + (v1 * 18 / 10);
        } else {
            /* extra 30% */
            v1 = v1 + (v1 * 13 / 10);
        }
    }

    /* Reduce danger from sleeping monsters */
    if (!kill->awake) {
        int inc = r_ptr->sleep + 5;
        /* Reduce the fear if Borg is higher level */
        if (borg.trait[BI_CLEVEL] >= 25) {
            v1 = v1 / 2;
        }

        /* Tweak danger based on the "alertness" of the monster */
        /* increase the danger for light sleepers */
        v1 = v1 + (v1 * inc / 100);
    }
    /* Reduce danger from sleeping monsters with the sleep 2 spell*/
    if (borg_sleep_spell_ii) {
        if ((d == 1) && (kill->awake) && (!(rf_has(r_ptr->flags, RF_NO_SLEEP)))
            && (!(rf_has(r_ptr->flags, RF_UNIQUE)))
            && (kill->level <= (borg.trait[BI_CLEVEL] - 15))) {
            /* Under special circumstances force the damage to 0 */
            if (borg.trait[BI_CLEVEL] < 20
                && borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 2) {
                v1 = 0;
            } else {
                v1 = v1 / 3;
            }
        }
    }
    /* Reduce danger from sleeping monsters with the sleep 1,3 spell*/
    if (borg_sleep_spell) {
        if (kill->awake && (!(rf_has(r_ptr->flags, RF_NO_SLEEP)))
            && (!(rf_has(r_ptr->flags, RF_UNIQUE)))
            && (kill->level <= (borg.trait[BI_CLEVEL] - 15))) {
            /* Under special circumstances force the damage to 0 */
            if (borg.trait[BI_CLEVEL] < 20
                && borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 2) {
                v1 = 0;
            } else {
                v1 = v1 / (d + 2);
            }
        }
    }
    if (borg_crush_spell) {
        /* HACK for now, either it dies or it doesn't.  */
        /* If we discover it isn't using this spell much, we can modify */
        if ((kill->power * kill->injury) / 100 < borg.trait[BI_CLEVEL] * 4)
            v1 = 0;
    }

    /* Reduce danger from confused monsters */
    if (kill->confused) {
        v1 = v1 / 2;
    }
    if (kill->stunned) {
        v1 = v1 * 10 / 13;
    }
    if (borg_confuse_spell) {
        if (kill->awake && !kill->confused
            && (!(rf_has(r_ptr->flags, RF_NO_SLEEP)))
            && (!(rf_has(r_ptr->flags, RF_UNIQUE)))
            && (kill->level <= (borg.trait[BI_CLEVEL] - 15))) {
            /* Under special circumstances force the damage to 0 */
            if (borg.trait[BI_CLEVEL] < 20
                && borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 2) {
                v1 = 0;
            } else {
                v1 = v1 / (d + 2);
            }
        }
    }
    /* Perceive a reduce danger from scared monsters */
    if (borg_fear_mon_spell) {
        v1 = 0;
    }

    /* Hack -- Physical attacks require proximity
     *
     * Note that we do try to consider a fast monster moving and attacking
     * in the same round.  We should consider monsters that have a speed 2 or 3
     * classes higher than ours, but most times, the borg will only encounter
     * monsters with a single category higher speed.
     */
    if (q > 10 && d != 1 && !(rf_has(r_ptr->flags, RF_NEVER_MOVE))) {
        b_v1 = 0;

        /* Check for a single grid movement, simulating the monster's move
         * action. */
        for (ii = 0; ii < 8; ii++) {
            /* Obtain a grid to which the monster might move */
            y_temp = y9 + ddy_ddd[ii];
            x_temp = x9 + ddx_ddd[ii];

            /* Check for legality */
            if (!square_in_bounds_fully(cave, loc(x_temp, y_temp)))
                continue;

            /* Cannot occupy another monster's grid */
            if (borg_grids[y_temp][x_temp].kill)
                continue;

            /* Cannot occupy a closed door */
            if (borg_grids[y_temp][x_temp].feat == FEAT_CLOSED)
                continue;

            /* Cannot occupy a perma-wall */
            if (borg_grids[y_temp][x_temp].feat == FEAT_PERM)
                continue;

            /* Cannot occupy a wall/seam grid (unless pass_wall or kill_wall) */
            if (borg_grids[y_temp][x_temp].feat == FEAT_GRANITE
                || (borg_grids[y_temp][x_temp].feat == FEAT_MAGMA
                    || borg_grids[y_temp][x_temp].feat == FEAT_QUARTZ
                    || borg_grids[y_temp][x_temp].feat == FEAT_MAGMA_K
                    || borg_grids[y_temp][x_temp].feat == FEAT_QUARTZ_K
                    || borg_grids[y_temp][x_temp].feat == FEAT_RUBBLE)) {
                /* legally on a wall of some sort, check for closeness*/
                if (rf_has(r_ptr->flags, RF_PASS_WALL)) {
                    if (borg_distance(y_temp, x_temp, y, x) == 1)
                        b_v1 = v1;
                }
                if (rf_has(r_ptr->flags, RF_KILL_WALL)) {
                    if (borg_distance(y_temp, x_temp, y, x) == 1)
                        b_v1 = v1;
                }
            }

            /* Is this grid being considered adjacent to the grid for which the
             * borg_danger() was called? */
            if (borg_distance(y_temp, x_temp, y, x) > 1)
                continue;

            /* A legal floor grid */
            if (borg_cave_floor_bold(y_temp, x_temp)) {
                /* Really fast monster can hit me more than once after it's move
                 */
                b_v1 = v1 * (q / (d * 10));
            }
        }

        /* Monster is not able to move and threaten me in the same round */
        v1 = b_v1;
    }

    /* Consider a monster that is fast and can strike more than once per round
     */
    if (q > 10 && d == 1) {
        v1 = v1 * q / 10;
    }

    /* Need to be close if you are normal speed */
    if (q == 10 && d > 1) {
        v1 = 0;
    }

    /** Ranged Attacks **/
    v2 = borg_danger_spell(i, y, x, d, average, full_damage);

    /* Never cast spells */
    if (!r_ptr->freq_innate && !r_ptr->freq_spell) {
        v2 = 0;
    }

    /* Hack -- verify distance */
    if (borg_distance(y9, x9, y, x) > z_info->max_range) {
        v2 = 0;
    }

    /* Hack -- verify line of sight (both ways) for monsters who can only move 1
     * grid. */
    if (q <= 10 && !borg_projectable(y9, x9, y, x)
        && !borg_projectable(y, x, y9, x9)) {
        v2 = 0;
    }

    /* Hack -- verify line of sight (both ways) for monsters who can only move >
     *1 grid. Some fast monsters can take a move action and range attack in the
     *same round. Basically, we see how many grids the monster can move and
     *check LOS from each of those grids to determine the relative danger.  We
     *need to make sure that the monster is not passing through walls unless he
     *has that ability. Consider a fast monster who can move and cast a spell in
     *the same round. This is important for a borg looking for a safe grid from
     *a ranged attacker. If the attacker is fast then he might be able to move
     *to a grid which does have LOS to the grid the borg is considering.
     *
     * ##############
     * #.....#.#.1#D#   Grids marked 2 are threatened by the D currently.
     * #####.#..##@##	Grids marked 1 are safe currently, but the fast D will
     *be able
     * #####.#..1221#	to move to the borg's grid after he moves and the D will
     *be able
     * ##############	to use a ranged attack to grids 1, all in the same
     *round. The borg should not consider grid 1 as safe.
     */
    if (q >= 20) {
        int b_q = q;
        b_v2    = 0;

        /* Maximal speed check */
        if (q > 20)
            q = 20;

        /* Check for a single grid movement, simulating the monster's move
         * action. */
        for (ii = 0; ii < 8; ii++) {
            /* Obtain a grid to which the monster might move */
            y_temp = y9 + ddy_ddd[ii];
            x_temp = x9 + ddx_ddd[ii];

            /* Check for legality */
            if (!square_in_bounds_fully(cave, loc(x_temp, y_temp)))
                continue;

            /* Cannot occupy another monster's grid */
            if (borg_grids[y_temp][x_temp].kill)
                continue;

            /* Cannot occupy a closed door */
            if (borg_grids[y_temp][x_temp].feat == FEAT_CLOSED)
                continue;

            /* Cannot occupy a perma-wall */
            if (borg_grids[y_temp][x_temp].feat == FEAT_PERM)
                continue;

            /* Cannot occupy a wall/seam grid (unless pass_wall or kill_wall) */
            if (borg_grids[y_temp][x_temp].feat >= FEAT_GRANITE
                || (borg_grids[y_temp][x_temp].feat == FEAT_MAGMA
                    || borg_grids[y_temp][x_temp].feat == FEAT_QUARTZ
                    || borg_grids[y_temp][x_temp].feat == FEAT_MAGMA_K
                    || borg_grids[y_temp][x_temp].feat == FEAT_QUARTZ_K
                    || borg_grids[y_temp][x_temp].feat == FEAT_RUBBLE)) {
                /* legally on a wall of some sort, check for LOS*/
                if (rf_has(r_ptr->flags, RF_PASS_WALL)) {
                    if (borg_projectable(y_temp, x_temp, y, x))
                        b_v2 = v2 * b_q / 10;
                }
                if (rf_has(r_ptr->flags, RF_KILL_WALL)) {
                    if (borg_projectable(y_temp, x_temp, y, x))
                        b_v2 = v2 * b_q / 10;
                }
            }

            /* Monster on a legal floor grid.  Can he see me? */
            else if (borg_projectable(y_temp, x_temp, y, x))
                b_v2 = v2 * b_q / 10;
        }

        /* Monster is not able to move and threaten me in the same round */
        v2 = b_v2;
    }

    /* Hack -- Under Stressful Situation.
     */
    if (borg.time_this_panel > 1200 || borg_t > 25000) {
        /* he might be stuck and could overflow */
        v2 = v2 / 5;
    }

    /* multipliers yield some trouble when I am weak */
    if ((rf_has(r_ptr->flags, RF_MULTIPLY)) && (borg.trait[BI_CLEVEL] < 20)) {
        v2 = v2 + (v2 * 12 / 10);
    }

    /* Friends yield some trouble when I am weak */
    if ((r_ptr->friends || r_ptr->friends_base)
        && (borg.trait[BI_CLEVEL] < 20)) {
        v2 = v2 + (v2 * 12 / 10);
    }

    /* Reduce danger from sleeping monsters */
    if (!kill->awake) {
        int inc = r_ptr->sleep + 5;
        /* weaklings and should still fear */
        if (borg.trait[BI_CLEVEL] >= 25) {
            v2 = v2 / 2;
        }

        /* Tweak danger based on the "alertness" of the monster */
        /* increase the danger for light sleepers */
        v2 = v2 + (v2 * inc / 100);
    }

    /* Reduce danger from sleeping monsters with the sleep 2 spell*/
    if (borg_sleep_spell_ii) {

        if ((d == 1) && (kill->awake) && (!(rf_has(r_ptr->flags, RF_NO_SLEEP)))
            && (!(rf_has(r_ptr->flags, RF_UNIQUE)))
            && (kill->level
                <= ((borg.trait[BI_CLEVEL] < 15)
                        ? borg.trait[BI_CLEVEL]
                        : (((borg.trait[BI_CLEVEL] - 10) / 4) * 3) + 10))) {
            v2 = v2 / 3;
        }
    }

    if (borg_crush_spell) {
        /* HACK for now, either it dies or it doesn't.  */
        /* If we discover it isn't using this spell much, we can modify */
        if ((kill->power * kill->injury) / 100 < borg.trait[BI_CLEVEL] * 4)
            v2 = 0;
    }

    /* Reduce danger from sleeping monsters with the sleep 1,3 spell*/
    if (borg_sleep_spell) {
        v2 = v2 / (d + 2);
    }
    /* Reduce danger from confused monsters */
    if (kill->confused) {
        v2 = v2 / 2;
    }
    /* Reduce danger from stunned monsters  */
    if (kill->stunned) {
        v2 = v2 * 10 / 13;
    }
    if (borg_confuse_spell) {
        v2 = v2 / 6;
    }

#if 0 /* They still cast spells, they are still dangerous */
    /* Reduce danger from scared monsters */
    if (borg_fear_mon_spell) {
        v2 = v2 * 8 / 10;
    }
    if (kill->afraid) {
        v2 = v2 * 8 / 10;
    }
#endif
    if (!full_damage) {
        /* reduce for frequency. */
        chance = (r_ptr->freq_innate + r_ptr->freq_spell) / 2;
        if (chance < 11)
            v2 = ((v2 * 4) / 10);
        else if (chance < 26)
            v2 = ((v2 * 6) / 10);
        else if (chance < 51)
            v2 = ((v2 * 8) / 10);
    }

    /* Danger */
    if (v2) {
        /* Full power */
        r = q;

        /* Total danger */
        v2 = v2 * r / 10;
    }

    /* Maximal danger */
    p = MAX(v1, v2);
    if (p > 2000)
        p = 2000;

    /* Result */
    return (p);
}